

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AStarFringe.cpp
# Opt level: O1

bool __thiscall AStarFringe::insertInFringe(AStarFringe *this,sptr *node)

{
  Heuristic *pHVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  Board *pBVar6;
  vector<Direction,_std::allocator<Direction>_> *pvVar7;
  _Hash_node_base *p_Var8;
  mapped_type *pmVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  double dVar15;
  undefined1 auVar16 [16];
  size_t hash;
  size_t local_48;
  value_type local_40;
  double local_28;
  double dStack_20;
  
  pBVar6 = SearchNode::getBoard
                     ((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_48 = Board::hash(pBVar6);
  pvVar7 = SearchNode::getPath((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
  lVar10 = (long)(pvVar7->super__Vector_base<Direction,_std::allocator<Direction>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar7->super__Vector_base<Direction,_std::allocator<Direction>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  lVar11 = lVar10 >> 2;
  auVar16._8_4_ = (int)(lVar10 >> 0x22);
  auVar16._0_8_ = lVar11;
  auVar16._12_4_ = 0x45300000;
  dStack_20 = auVar16._8_8_ - 1.9342813113834067e+25;
  local_28 = dStack_20 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  pHVar1 = this->heuristic;
  pBVar6 = SearchNode::getBoard
                     ((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  dVar15 = (*pHVar1)(pBVar6);
  pBVar6 = SearchNode::getBoard
                     ((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  p_Var8 = (_Hash_node_base *)Board::hash(pBVar6);
  uVar2 = (this->leastCosts)._M_h._M_bucket_count;
  uVar12 = (ulong)p_Var8 % uVar2;
  p_Var3 = (this->leastCosts)._M_h._M_buckets[uVar12];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var14 = p_Var3->_M_nxt, p_Var13 = p_Var3, p_Var8 != p_Var14[1]._M_nxt)) {
    while (p_Var4 = p_Var14->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar12) ||
         (p_Var13 = p_Var14, p_Var14 = p_Var4, p_Var8 == p_Var4[1]._M_nxt)) goto LAB_001121cf;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_001121cf:
  dVar15 = dVar15 + local_28;
  if ((p_Var13 == (__node_base_ptr)0x0) ||
     ((p_Var13->_M_nxt == (_Hash_node_base *)0x0 ||
      (pmVar9 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->leastCosts,&local_48), dVar15 < *pmVar9)))) {
    local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_40.cost = dVar15;
    std::
    priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
    ::push(&this->fringe,&local_40);
    if (local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pmVar9 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->leastCosts,&local_48);
    *pmVar9 = dVar15;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool AStarFringe::insertInFringe(const SearchNode::sptr& node) {
    size_t hash = node->getBoard().hash();
    double cost = node->getPath().size() + heuristic(node->getBoard());

    if (leastCosts.contains(node->getBoard().hash())) {
        double leastNodeCost = leastCosts[hash];

        if (leastNodeCost <= cost) {
            // Already seen a cheaper node with the same board state, discard
            return false;
        }
    }

    fringe.push({ node, cost });
    leastCosts[hash] = cost;

    return true;
}